

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::ExclusiveJoinPromiseNode::Branch::Branch
          (Branch *this,ExclusiveJoinPromiseNode *joinNode,Own<kj::_::PromiseNode> *dependencyParam)

{
  PromiseNode *pPVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  Event::Event(&this->super_Event);
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_00677988;
  this->joinNode = joinNode;
  uVar2 = *(undefined4 *)((long)&dependencyParam->disposer + 4);
  uVar3 = *(undefined4 *)&dependencyParam->ptr;
  uVar4 = *(undefined4 *)((long)&dependencyParam->ptr + 4);
  *(undefined4 *)&(this->dependency).disposer = *(undefined4 *)&dependencyParam->disposer;
  *(undefined4 *)((long)&(this->dependency).disposer + 4) = uVar2;
  *(undefined4 *)&(this->dependency).ptr = uVar3;
  *(undefined4 *)((long)&(this->dependency).ptr + 4) = uVar4;
  dependencyParam->ptr = (PromiseNode *)0x0;
  pPVar1 = (this->dependency).ptr;
  (*pPVar1->_vptr_PromiseNode[1])(pPVar1,&this->dependency);
  pPVar1 = (this->dependency).ptr;
  (**pPVar1->_vptr_PromiseNode)(pPVar1,this);
  return;
}

Assistant:

ExclusiveJoinPromiseNode::Branch::Branch(
    ExclusiveJoinPromiseNode& joinNode, Own<PromiseNode> dependencyParam)
    : joinNode(joinNode), dependency(kj::mv(dependencyParam)) {
  dependency->setSelfPointer(&dependency);
  dependency->onReady(this);
}